

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O0

ON_SHA1_Hash *
ON_SHA1_Hash::BufferContentHash
          (ON_SHA1_Hash *__return_storage_ptr__,void *buffer,size_t sizeof_buffer)

{
  undefined1 local_98 [8];
  ON_SHA1 sha1;
  size_t sizeof_buffer_local;
  void *buffer_local;
  
  if ((buffer == (void *)0x0) || (sizeof_buffer == 0)) {
    *(undefined8 *)__return_storage_ptr__->m_digest = EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)(__return_storage_ptr__->m_digest + 8) = EmptyContentHash.m_digest._8_8_;
    *(undefined4 *)(__return_storage_ptr__->m_digest + 0x10) = EmptyContentHash.m_digest._16_4_;
  }
  else {
    sha1.m_sha1_hash.m_digest._12_8_ = sizeof_buffer;
    ON_SHA1::ON_SHA1((ON_SHA1 *)local_98);
    ON_SHA1::AccumulateBytes((ON_SHA1 *)local_98,buffer,sha1.m_sha1_hash.m_digest._12_8_);
    ON_SHA1::Hash(__return_storage_ptr__,(ON_SHA1 *)local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_SHA1_Hash ON_SHA1_Hash::BufferContentHash(
  const void* buffer,
  size_t sizeof_buffer
  )
{
  if ( nullptr == buffer || sizeof_buffer <= 0 )
    return ON_SHA1_Hash::EmptyContentHash;
  ON_SHA1 sha1;
  sha1.AccumulateBytes(buffer,sizeof_buffer);
  return sha1.Hash();
}